

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

IterationResult __thiscall
helics::Federate::enterExecutingMode(Federate *this,IterationRequest iterate)

{
  element_type *peVar1;
  IterationResult IVar2;
  int iVar3;
  undefined4 extraout_var;
  InvalidFunctionCall *this_00;
  uint extraout_EDX;
  string_view message;
  iteration_time iVar4;
  
  switch((this->currentMode)._M_i) {
  case STARTUP:
  case PENDING_INIT:
    enterInitializingMode(this);
  case INITIALIZING:
    peVar1 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (*peVar1->_vptr_Core[0x15])
                      (peVar1,(ulong)(uint)(this->fedID).fid,(ulong)(uint)(int)(char)iterate);
    iVar4.grantedTime.internalTimeCode._4_4_ = extraout_var;
    iVar4.grantedTime.internalTimeCode._0_4_ = iVar3;
    IVar2 = (IterationResult)extraout_EDX;
    iVar4._8_4_ = extraout_EDX & 0xff;
    iVar4._12_4_ = 0;
    enteringExecutingMode(this,iVar4);
    break;
  default:
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str = "cannot transition from current state to execution state";
    message._M_len = 0x37;
    InvalidFunctionCall::InvalidFunctionCall(this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  case PENDING_EXEC:
    IVar2 = enterExecutingModeComplete(this);
    return IVar2;
  case PENDING_TIME:
    requestTimeComplete(this);
  case EXECUTING:
    IVar2 = NEXT_STEP;
    break;
  case PENDING_ITERATIVE_TIME:
    iVar4 = requestTimeIterativeComplete(this);
    IVar2 = iVar4.state;
    if (IVar2 == ITERATING) {
      IVar2 = NEXT_STEP;
    }
  }
  return IVar2;
}

Assistant:

void Federate::enteringInitializingMode(IterationResult iterating)
{
    updateFederateMode(Modes::INITIALIZING);
    mCurrentTime = coreObject->getCurrentTime(fedID);
    if (iterating == IterationResult::NEXT_STEP) {
        startupToInitializeStateTransition();
    }
    if (initializingEntryCallback) {
        initializingEntryCallback(iterating != IterationResult::NEXT_STEP);
    }
}